

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::DataSourceDescriptor::DataSourceDescriptor
          (DataSourceDescriptor *this,DataSourceDescriptor *param_1)

{
  pointer pcVar1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__DataSourceDescriptor_003a0c48;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (param_1->name_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + (param_1->name_)._M_string_length);
  *(undefined4 *)((long)&this->id_ + 7) = *(undefined4 *)((long)&param_1->id_ + 7);
  this->id_ = param_1->id_;
  (this->gpu_counter_descriptor_)._M_dataplus._M_p =
       (pointer)&(this->gpu_counter_descriptor_).field_2;
  pcVar1 = (param_1->gpu_counter_descriptor_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->gpu_counter_descriptor_,pcVar1,
             pcVar1 + (param_1->gpu_counter_descriptor_)._M_string_length);
  (this->track_event_descriptor_)._M_dataplus._M_p =
       (pointer)&(this->track_event_descriptor_).field_2;
  pcVar1 = (param_1->track_event_descriptor_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->track_event_descriptor_,pcVar1,
             pcVar1 + (param_1->track_event_descriptor_)._M_string_length);
  (this->ftrace_descriptor_)._M_dataplus._M_p = (pointer)&(this->ftrace_descriptor_).field_2;
  pcVar1 = (param_1->ftrace_descriptor_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ftrace_descriptor_,pcVar1,
             pcVar1 + (param_1->ftrace_descriptor_)._M_string_length);
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  pcVar1 = (param_1->unknown_fields_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->unknown_fields_,pcVar1,
             pcVar1 + (param_1->unknown_fields_)._M_string_length);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

DataSourceDescriptor::DataSourceDescriptor(const DataSourceDescriptor&) = default;